

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O0

void anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  char *name_00;
  class_<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>,anurbs::CurveBase<2l>,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>>
  *this;
  code *local_a8;
  undefined8 local_a0;
  arg local_98;
  arg local_88;
  arg local_78;
  arg local_68;
  constructor<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_anurbs::Interval> local_55 [13];
  handle local_48;
  class_<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>_>
  local_40;
  string local_38 [8];
  string name;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_local;
  module *m_local;
  
  name.field_2._8_8_ = model;
  python_name_abi_cxx11_();
  local_48.m_ptr = (m->super_object).super_handle.m_ptr;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::
  class_<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>_>
  ::class_<>(&local_40,local_48,name_00);
  pybind11::init<anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>,anurbs::Interval>();
  local_78 = pybind11::literals::operator____a("geometry",8);
  local_68.name = local_78.name;
  local_68._8_1_ = local_78._8_1_;
  local_98 = pybind11::literals::operator____a("domain",6);
  local_88.name = local_98.name;
  local_88._8_1_ = local_98._8_1_;
  this = (class_<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>,anurbs::CurveBase<2l>,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>>
          *)pybind11::
            class_<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>,anurbs::CurveBase<2l>,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>>
            ::
            def<anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>,anurbs::Interval,pybind11::arg,pybind11::arg>
                      ((class_<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>,anurbs::CurveBase<2l>,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>>
                        *)&local_40,local_55,&local_68,&local_88);
  local_a8 = Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>::curve_geometry;
  local_a0 = 0;
  pybind11::
  class_<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>,anurbs::CurveBase<2l>,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>>
  ::
  def<anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>(anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>::*)()const>
            (this,"curve_geometry",(offset_in_Model_to_subr *)&local_a8);
  pybind11::
  class_<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>_>
  ::~class_(&local_40);
  Model::register_python_data_type<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>
            (m,(class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)name.field_2._8_8_);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = Curve<TDimension, TRef>;
        using Holder = Pointer<Type>;
        using Base = CurveBase<TDimension>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            .def(py::init<TRef, Interval>(), "geometry"_a, "domain"_a)
            .def("curve_geometry", &Type::curve_geometry)
        ;

        Model::register_python_data_type<Type>(m, model);
    }